

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,basic_string_view<char> s,format_specs *specs)

{
  char *size;
  char *width;
  basic_appender<char> bVar1;
  format_specs *specs_00;
  uint uVar2;
  bool bVar3;
  string_view s_00;
  basic_string_view<char> str;
  string_view s_01;
  counting_buffer<char> buf;
  anon_class_40_4_6b3cdfe0 local_158 [7];
  long local_38;
  
  specs_00 = (format_specs *)s.size_;
  str.size_ = s.data_;
  s_00.size_ = (char *)(long)specs_00->precision;
  size = str.size_;
  if ((-1 < (long)s_00.size_) && (s_00.size_ < str.size_)) {
    s_00.data_ = str.size_;
    size = (char *)code_point_index((detail *)out.container,s_00,(size_t)specs_00);
  }
  uVar2 = (specs_00->super_basic_specs).data_ & 7;
  if (uVar2 == 1) {
    local_158[0]._0_8_ = &local_158[0].size;
    local_158[0].s.data_ = (char *)0x0;
    local_158[0].s.size_ = 0x100;
    local_158[0].data = (char *)counting_buffer<char>::grow;
    local_38 = 0;
    str.data_ = (char *)out.container;
    write_escaped_string<char,fmt::v11::basic_appender<char>>((buffer<char> *)local_158,str);
    size = local_158[0].s.data_ + local_38;
  }
  bVar3 = specs_00->width != 0;
  width = (char *)0x0;
  if (bVar3) {
    width = size;
  }
  if (bVar3 && uVar2 != 1) {
    s_01.size_ = (size_t)size;
    s_01.data_ = (char *)out.container;
    width = (char *)compute_width(s_01);
  }
  local_158[0].is_debug = uVar2 == 1;
  local_158[0].s.data_ = (char *)out.container;
  local_158[0].s.size_ = (size_t)str.size_;
  local_158[0].data = (char *)out.container;
  local_158[0].size = (size_t)size;
  bVar1 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,specs_00,(size_t)size,(size_t)width,local_158);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));

  bool is_debug = specs.type() == presentation_type::debug;
  if (is_debug) {
    auto buf = counting_buffer<Char>();
    write_escaped_string(basic_appender<Char>(buf), s);
    size = buf.count();
  }

  size_t width = 0;
  if (specs.width != 0) {
    width =
        is_debug ? size : compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded<Char>(
      out, specs, size, width, [=](reserve_iterator<OutputIt> it) {
        return is_debug ? write_escaped_string(it, s)
                        : copy<Char>(data, data + size, it);
      });
}